

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O2

void __thiscall Fl_Function_Type::read_property(Fl_Function_Type *this,char *c)

{
  int iVar1;
  char *n;
  
  iVar1 = strcmp(c,"private");
  if (iVar1 == 0) {
    this->public_ = '\0';
  }
  else {
    iVar1 = strcmp(c,"protected");
    if (iVar1 == 0) {
      this->public_ = '\x02';
    }
    else {
      if ((*c != 'C') || (c[1] != '\0')) {
        iVar1 = strcmp(c,"return_type");
        if (iVar1 != 0) {
          Fl_Type::read_property(&this->super_Fl_Type,c);
          return;
        }
        n = read_word(0);
        storestring(n,&this->return_type,0);
        return;
      }
      this->cdecl_ = '\x01';
    }
  }
  return;
}

Assistant:

void Fl_Function_Type::read_property(const char *c) {
  if (!strcmp(c,"private")) {
    public_ = 0;
  } else if (!strcmp(c,"protected")) {
    public_ = 2;
  } else if (!strcmp(c,"C")) {
    cdecl_ = 1;
  } else if (!strcmp(c,"return_type")) {
    storestring(read_word(),return_type);
  } else {
    Fl_Type::read_property(c);
  }
}